

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

bool slang::isSignExtended
               (uint64_t *input,uint32_t numWords,uint32_t word,uint32_t bit,uint64_t topWordMask)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = input[word];
  bVar2 = (byte)bit;
  if ((uVar1 >> ((ulong)bit & 0x3f) & 1) == 0) {
    topWordMask = 0;
  }
  else {
    uVar4 = numWords - 1;
    if ((word < uVar4) &&
       (bVar5 = input[uVar4] != topWordMask, topWordMask = 0xffffffffffffffff, numWords = uVar4,
       bVar5)) {
      return false;
    }
  }
  uVar3 = -(ulong)((1L << (bVar2 & 0x3f) & uVar1) != 0);
  uVar4 = numWords - 1;
  while( true ) {
    if (uVar4 <= word) {
      if (numWords - 1 == word) {
        uVar3 = topWordMask;
      }
      return uVar1 >> (bVar2 & 0x3f) == uVar3 >> (bVar2 & 0x3f);
    }
    if (input[uVar4] != uVar3) break;
    uVar4 = uVar4 - 1;
  }
  return false;
}

Assistant:

static bool isSignExtended(const uint64_t* input, uint32_t numWords, uint32_t word, uint32_t bit,
                           uint64_t topWordMask) {
    bool sign = (input[word] & (1ULL << bit)) != 0;
    if (sign && numWords - 1 > word) {
        if (input[numWords - 1] != topWordMask)
            return false;
        numWords--;
        topWordMask = UINT64_MAX;
    }

    uint64_t mask = sign ? UINT64_MAX : 0;
    for (auto i = numWords - 1; i > word; i--) {
        if (input[i] != mask)
            return false;
    }

    if (numWords - 1 == word)
        mask &= topWordMask;
    mask >>= bit;
    return (input[word] >> bit) == mask;
}